

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::formatReconstructedExpression(ostream *os,string *lhs,StringRef *op,string *rhs)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  
  if (rhs->_M_string_length + lhs->_M_string_length < 0x28) {
    lVar1 = std::__cxx11::string::find((char)lhs,10);
    if (lVar1 == -1) {
      lVar1 = std::__cxx11::string::find((char)rhs,10);
      if (lVar1 == -1) {
        pcVar3 = " ";
        goto LAB_0011c7b6;
      }
    }
  }
  pcVar3 = "\n";
LAB_0011c7b6:
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)os,(lhs->_M_dataplus)._M_p,lhs->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,1);
  poVar2 = (ostream *)std::ostream::write((char *)poVar2,(long)op->m_start);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(rhs->_M_dataplus)._M_p,rhs->_M_string_length);
  return;
}

Assistant:

void formatReconstructedExpression( std::ostream &os, std::string const& lhs, StringRef op, std::string const& rhs ) {
        if( lhs.size() + rhs.size() < 40 &&
                lhs.find('\n') == std::string::npos &&
                rhs.find('\n') == std::string::npos )
            os << lhs << " " << op << " " << rhs;
        else
            os << lhs << "\n" << op << "\n" << rhs;
    }